

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_rule.hpp
# Opt level: O1

error_code __thiscall
pstore::exchange::import_ns::rule::
push<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>*,pstore::gsl::not_null<pstore::exchange::import_ns::string_mapping_const*>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::fragment>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
          (rule *this,
          vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> *args,
          not_null<const_pstore::exchange::import_ns::string_mapping_*> args_1,
          shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
          *args_2)

{
  iterator *piVar1;
  context *pcVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Elt_pointer puVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  pointer *__ptr;
  _Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false> local_38;
  _Head_base<0UL,_pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_*,_false>
  local_30;
  
  pcVar2 = (this->context_).ptr_;
  local_30._M_head_impl =
       (array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
        *)operator_new(0x30);
  peVar3 = (args_2->
           super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  this_00 = (args_2->
            super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
            )._M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ((local_30._M_head_impl)->super_rule).context_.ptr_ = pcVar2;
    ((local_30._M_head_impl)->super_rule)._vptr_rule = (_func_int **)&PTR__array_rule_0015cc50;
    *(element_type **)
     &((local_30._M_head_impl)->args_).
      super__Tuple_impl<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
      .
      super__Tuple_impl<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
         = peVar3;
    ((local_30._M_head_impl)->args_).
    super__Tuple_impl<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
    .
    super__Tuple_impl<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
    .
    super__Tuple_impl<2UL,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
    .
    super__Head_base<2UL,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_false>
    ._M_head_impl.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
    ((local_30._M_head_impl)->super_rule).context_.ptr_ = pcVar2;
    ((local_30._M_head_impl)->super_rule)._vptr_rule = (_func_int **)&PTR__array_rule_0015cc50;
    *(element_type **)
     &((local_30._M_head_impl)->args_).
      super__Tuple_impl<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
      .
      super__Tuple_impl<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
         = peVar3;
    ((local_30._M_head_impl)->args_).
    super__Tuple_impl<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
    .
    super__Tuple_impl<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
    .
    super__Tuple_impl<2UL,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
    .
    super__Head_base<2UL,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>,_false>
    ._M_head_impl.
    super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = this_00;
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  ((local_30._M_head_impl)->args_).
  super__Tuple_impl<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  .
  super__Tuple_impl<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
  .
  super__Head_base<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_false>
  ._M_head_impl.ptr_ = args_1.ptr_;
  *(vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_> **)
   &((_Tuple_impl<1UL,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
      *)&((local_30._M_head_impl)->args_).
         super__Tuple_impl<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
         .
         super__Head_base<0UL,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_false>
    )->
    super__Tuple_impl<2UL,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
       = args;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  local_38._M_head_impl = &(local_30._M_head_impl)->super_rule;
  local_30._M_head_impl =
       (array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>
        *)0x0;
  puVar4 = (pcVar2->stack).c.
           super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (puVar4 == (pcVar2->stack).c.
                super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
    ::
    _M_push_back_aux<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>
              ((deque<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>,std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,std::default_delete<pstore::exchange::import_ns::rule>>>>
                *)&pcVar2->stack,
               (unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
                *)&local_38);
  }
  else {
    (puVar4->_M_t).
    super___uniq_ptr_impl<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>
    ._M_t.
    super__Tuple_impl<0UL,_pstore::exchange::import_ns::rule_*,_std::default_delete<pstore::exchange::import_ns::rule>_>
    .super__Head_base<0UL,_pstore::exchange::import_ns::rule_*,_false>._M_head_impl =
         local_38._M_head_impl;
    local_38._M_head_impl = (rule *)0x0;
    piVar1 = &(pcVar2->stack).c.
              super__Deque_base<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>,_std::allocator<std::unique_ptr<pstore::exchange::import_ns::rule,_std::default_delete<pstore::exchange::import_ns::rule>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  if (local_38._M_head_impl != (rule *)0x0) {
    (*(local_38._M_head_impl)->_vptr_rule[1])();
  }
  local_38._M_head_impl = (rule *)0x0;
  std::
  unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
  ::~unique_ptr((unique_ptr<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>,_std::default_delete<pstore::exchange::import_ns::array_rule<pstore::exchange::import_ns::definition_object,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_*,_pstore::gsl::not_null<const_pstore::exchange::import_ns::string_mapping_*>,_std::shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::fragment>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_>_>_>
                 *)&local_30);
  log_top(this,true);
  uVar6 = std::_V2::system_category();
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar6;
  return (error_code)(auVar5 << 0x40);
}

Assistant:

std::error_code push (Args... args) {
                    context_->stack.push (std::make_unique<T> (context_, args...));
                    this->log_top (true);
                    return {};
                }